

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::util_getPrimalDualValues
          (HModel *this,vector<double,_std::allocator<double>_> *colValue,
          vector<double,_std::allocator<double>_> *colDual,
          vector<double,_std::allocator<double>_> *rowValue,
          vector<double,_std::allocator<double>_> *rowDual)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  size_type __new_size;
  long lVar6;
  long lVar7;
  size_type sVar8;
  vector<double,_std::allocator<double>_> dual;
  vector<double,_std::allocator<double>_> value;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_40,&this->workValue);
  iVar1 = this->numRow;
  if (0 < (long)iVar1) {
    piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[lVar6]] = pdVar4[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_58,&this->workDual);
  iVar1 = this->numRow;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[lVar5]] = 0.0;
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  __new_size = (size_type)this->numCol;
  if (0 < (long)__new_size) {
    pdVar4 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar8] =
           pdVar4[sVar8] *
           local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[sVar8];
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar8] =
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[sVar8] / pdVar4[sVar8];
      sVar8 = sVar8 + 1;
    } while (__new_size != sVar8);
  }
  if (0 < iVar1) {
    pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[__new_size + lVar5] =
           local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[__new_size + lVar5] / pdVar4[lVar5];
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[__new_size + lVar5] =
           pdVar4[lVar5] *
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[__new_size + lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  std::vector<double,_std::allocator<double>_>::resize(colValue,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(colDual,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(rowValue,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(rowDual,(long)this->numRow);
  iVar1 = this->numRow;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    iVar2 = this->numCol;
    pdVar4 = (rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar4[lVar5] =
           -local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2 + lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  iVar2 = this->numCol;
  lVar5 = (long)iVar2;
  if (0 < lVar5) {
    pdVar4 = (colValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pdVar4[lVar7] =
           local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
  }
  if (0 < iVar1) {
    iVar1 = this->objSense;
    pdVar4 = (rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pdVar4[lVar7] =
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5 + lVar7] * (double)iVar1;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  if (0 < iVar2) {
    iVar1 = this->objSense;
    pdVar4 = (colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pdVar4[lVar6] =
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6] * (double)iVar1;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HModel::util_getPrimalDualValues(vector<double>& colValue, vector<double>& colDual,
				      vector<double>& rowValue, vector<double>& rowDual) {
	// Take primal solution
	vector<double> value = workValue;
	for (int iRow = 0; iRow < numRow; iRow++)
		value[basicIndex[iRow]] = baseValue[iRow];
	// Take dual solution
	vector<double> dual = workDual;
	for (int iRow = 0; iRow < numRow; iRow++)
		dual[basicIndex[iRow]] = 0;
	// Scale back 
	for (int iCol = 0; iCol < numCol; iCol++) {
		value[iCol] *= colScale[iCol];
		dual[iCol] /= colScale[iCol];

	}
	for (int iRow = 0, iTot = numCol; iRow < numRow; iRow++, iTot++) {
		value[iTot] /= rowScale[iRow];
		dual[iTot] *= rowScale[iRow];
	}
	
	//************** part 2: gepr and gedu
	// Now we can get the solution
	colValue.resize(numCol);
	colDual.resize(numCol); 
	rowValue.resize(numRow);
	rowDual.resize(numRow);
 
	double *valuePtr = &value[0];
    for (int i = 0; i < numRow; i++)
        rowValue[i] = -valuePtr[i + numCol];
    for (int i = 0; i < numCol; i++)
        colValue[i] = valuePtr[i];
    for (int i = 0; i < numRow; i++)
        rowDual[i] = objSense*dual[i + numCol];
    for (int i = 0; i < numCol; i++)
        colDual[i] = objSense*dual[i];
}